

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

void __thiscall EDCircles::ValidateCircles(EDCircles *this)

{
  int iVar1;
  EllipseEquation *eq_00;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  Circle *pCVar7;
  uchar *puVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  double *px;
  double *py;
  NFALUT *pNVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  int iVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  EllipseEquation eq;
  EllipseEquation local_68;
  
  iVar19 = (this->super_EDPF).super_ED.width;
  iVar16 = (this->super_EDPF).super_ED.height;
  iVar17 = iVar16 + iVar19;
  iVar15 = iVar17 * 8;
  uVar31 = 0xffffffffffffffff;
  if (-1 < iVar17) {
    uVar31 = (long)iVar15 << 3;
  }
  px = (double *)operator_new__(uVar31);
  py = (double *)operator_new__(uVar31);
  dVar9 = log10((double)(iVar16 * iVar19));
  dVar10 = log10((double)((this->super_EDPF).super_ED.height + (this->super_EDPF).super_ED.width));
  iVar17 = (this->super_EDPF).super_ED.width;
  iVar19 = (this->super_EDPF).super_ED.height;
  iVar16 = iVar19 + iVar17;
  iVar17 = iVar19 + iVar17 + 7;
  if (-1 < iVar16) {
    iVar17 = iVar16;
  }
  pNVar13 = (NFALUT *)operator_new(0x20);
  NFALUT::NFALUT(pNVar13,iVar17 >> 3,0.125,dVar9 + dVar9 + dVar10);
  this->nfa = pNVar13;
  if (this->noCircles1 < 1) {
    iVar17 = 0;
  }
  else {
    iVar17 = 0;
    iVar19 = 0;
    do {
      pCVar7 = this->circles1;
      dVar9 = pCVar7[iVar19].r;
      iVar16 = (this->super_EDPF).super_ED.width;
      iVar27 = (this->super_EDPF).super_ED.height;
      if (iVar27 < iVar16) {
        iVar27 = iVar16;
      }
      if (dVar9 <= (double)iVar27) {
        dVar10 = pCVar7[iVar19].xc;
        dVar2 = pCVar7[iVar19].yc;
        eq_00 = &pCVar7[iVar19].eq;
        dVar35 = computeEllipsePerimeter(eq_00);
        if (iVar15 < (int)dVar35) {
          iVar19 = iVar19 + 1;
        }
        else {
          if (pCVar7[iVar19].isEllipse == true) {
            uVar28 = (int)dVar35 & 0xfffffffe;
            uVar31 = (ulong)uVar28;
            ComputeEllipsePoints(eq_00->coeff,px,py,uVar28);
          }
          else {
            dVar35 = 0.0;
            uVar31 = 0;
            do {
              dVar36 = cos(dVar35);
              dVar37 = sin(dVar35);
              dVar35 = dVar35 + 6.283185307179586 / (double)(int)(dVar9 * 6.283185307179586 + 0.5);
              px[uVar31] = (double)(int)(dVar36 * dVar9 + dVar10 + 0.5);
              py[uVar31] = (double)(int)(dVar37 * dVar9 + dVar2 + 0.5);
              uVar31 = uVar31 + 1;
            } while (dVar35 < 6.283185307179586);
          }
          if ((int)uVar31 < 1) {
            iVar27 = 0;
            iVar16 = 0;
          }
          else {
            uVar22 = 0;
            iVar30 = -1;
            iVar21 = -1;
            iVar16 = 0;
            iVar27 = 0;
            do {
              iVar29 = (int)(py[uVar22] + 0.5);
              iVar20 = (int)(px[uVar22] + 0.5);
              if (((iVar30 != iVar29) || (iVar21 != iVar20)) && (iVar16 = iVar16 + 1, 0 < iVar29)) {
                iVar5 = (this->super_EDPF).super_ED.height;
                iVar1 = iVar5 + -1;
                if ((iVar29 < iVar1) && (0 < iVar20)) {
                  iVar6 = (this->super_EDPF).super_ED.width;
                  if (iVar20 < iVar6 + -1) {
                    puVar8 = (this->super_EDPF).super_ED.edgeImg;
                    iVar23 = iVar6 * iVar29;
                    iVar32 = iVar20;
                    iVar26 = iVar29;
                    iVar30 = iVar29;
                    iVar21 = iVar20;
                    if (puVar8[iVar23 + iVar20] != 0xff) {
                      iVar25 = (int)((((double)iVar29 - dVar2) + (double)iVar20) - dVar10);
                      if ((int)((((double)iVar29 - dVar2) - (double)iVar20) + dVar10) < 0) {
                        if (iVar25 < 1) goto LAB_0010ea48;
LAB_0010eafe:
                        if ((iVar20 == 1) || (puVar8[iVar23 + iVar20 + -1] != 0xff)) {
                          iVar32 = iVar20 + 1;
                          if ((iVar6 + -1 <= iVar32) || (puVar8[iVar23 + iVar32] != 0xff)) {
                            if ((iVar20 < 4) || (puVar8[iVar23 + iVar20 + -2] != 0xff)) {
                              iVar32 = iVar20 + 2;
                              if ((iVar6 + -2 <= iVar32) || (puVar8[iVar23 + iVar32] != 0xff))
                              goto LAB_0010eb60;
                            }
                            else {
                              iVar32 = iVar20 + -2;
                            }
                          }
                        }
                        else {
                          iVar32 = iVar20 + -1;
                        }
                        bVar12 = true;
                      }
                      else {
                        if (iVar25 < 1) goto LAB_0010eafe;
LAB_0010ea48:
                        if (((((iVar29 == 1) ||
                              (iVar26 = iVar29 + -1, puVar8[iVar6 * iVar26 + iVar20] != 0xff)) &&
                             ((iVar26 = iVar29 + 1, iVar1 <= iVar26 ||
                              (puVar8[iVar6 * iVar26 + iVar20] != 0xff)))) &&
                            ((iVar29 < 4 ||
                             (iVar26 = iVar29 + -2, puVar8[iVar6 * iVar26 + iVar20] != 0xff)))) &&
                           ((iVar26 = iVar29 + 2, iVar5 + -2 <= iVar26 ||
                            (puVar8[iVar6 * iVar26 + iVar20] != 0xff)))) {
LAB_0010eb60:
                          bVar12 = false;
                          iVar32 = iVar20;
                          iVar26 = iVar29;
                        }
                        else {
                          bVar12 = true;
                        }
                      }
                      if (!bVar12) goto LAB_0010eade;
                    }
                    lVar18 = (long)(iVar26 * iVar6 + iVar32);
                    puVar8 = (this->super_EDPF).super_ED.smoothImg;
                    lVar24 = (long)((iVar26 + 1) * iVar6 + iVar32);
                    lVar14 = (long)((iVar26 + -1) * iVar6 + iVar32);
                    dVar9 = NFALUT::myAtan2((double)(int)(((uint)puVar8[lVar18 + 1] +
                                                           ((uint)puVar8[lVar14 + 1] -
                                                           (uint)puVar8[lVar24 + -1]) +
                                                          ((uint)puVar8[lVar24 + 1] -
                                                          (uint)puVar8[lVar14 + -1])) -
                                                         (uint)puVar8[lVar18 + -1]),
                                            (double)(int)((((uint)puVar8[lVar14 + 1] -
                                                           (uint)puVar8[lVar24 + -1]) -
                                                          ((uint)puVar8[lVar24] +
                                                          ((uint)puVar8[lVar24 + 1] -
                                                          (uint)puVar8[lVar14 + -1]))) +
                                                         (uint)puVar8[lVar14]));
                    dVar36 = (double)iVar32;
                    dVar35 = (double)iVar26;
                    if (pCVar7[iVar19].isEllipse == true) {
                      dVar37 = pCVar7[iVar19].eq.coeff[1];
                      dVar3 = pCVar7[iVar19].eq.coeff[2];
                      dVar37 = (dVar37 + dVar37) * dVar36 + dVar3 * dVar35 +
                               pCVar7[iVar19].eq.coeff[4];
                      dVar4 = pCVar7[iVar19].eq.coeff[3];
                      dVar35 = dVar3 * dVar36 + (dVar4 + dVar4) * dVar35 +
                               pCVar7[iVar19].eq.coeff[5];
                    }
                    else {
                      dVar37 = dVar36 - dVar10;
                      dVar35 = dVar35 - dVar2;
                    }
                    dVar35 = NFALUT::myAtan2(dVar37,-dVar35);
                    iVar27 = iVar27 + (uint)(ABS(dVar9 - dVar35) <= 0.19634954084936207 ||
                                            2.945243112740431 <= ABS(dVar9 - dVar35));
                  }
                }
              }
LAB_0010eade:
              uVar22 = uVar22 + 1;
            } while ((uVar31 & 0xffffffff) != uVar22);
          }
          if (pCVar7[iVar19].isEllipse != false) {
            computeEllipsePerimeter(eq_00);
          }
          bVar12 = NFALUT::checkValidationByNFA(this->nfa,iVar16,iVar27);
          if (bVar12) {
            lVar14 = (long)iVar17;
            iVar17 = iVar17 + 1;
            memcpy(this->circles2 + lVar14,this->circles1 + iVar19,0x98);
            uVar28 = 1;
          }
          else {
            uVar28 = 1;
            if ((pCVar7[iVar19].isEllipse == false) && (0.5 <= pCVar7[iVar19].coverRatio)) {
              local_68.coeff[4] = 0.0;
              local_68.coeff[5] = 0.0;
              local_68.coeff[2] = 0.0;
              local_68.coeff[3] = 0.0;
              local_68.coeff[0] = 0.0;
              local_68.coeff[1] = 0.0;
              local_68.coeff[6] = 0.0;
              bVar12 = EllipseFit(pCVar7[iVar19].x,pCVar7[iVar19].y,pCVar7[iVar19].noPixels,
                                  &local_68,1);
              uVar33 = 0x20000000;
              uVar34 = 0x4202a05f;
              if (bVar12) {
                dVar9 = ComputeEllipseError(&local_68,pCVar7[iVar19].x,pCVar7[iVar19].y,
                                            pCVar7[iVar19].noPixels);
                uVar33 = SUB84(dVar9,0);
                uVar34 = (undefined4)((ulong)dVar9 >> 0x20);
              }
              if ((double)CONCAT44(uVar34,uVar33) <= 1.5) {
                pCVar7[iVar19].isEllipse = true;
                pCVar7[iVar19].ellipseFitError = (double)CONCAT44(uVar34,uVar33);
                pCVar7[iVar19].eq.coeff[6] = local_68.coeff[6];
                auVar11._8_8_ = local_68.coeff[3];
                auVar11._0_8_ = local_68.coeff[2];
                pCVar7[iVar19].eq.coeff[4] = local_68.coeff[4];
                pCVar7[iVar19].eq.coeff[5] = local_68.coeff[5];
                *(undefined1 (*) [16])(pCVar7[iVar19].eq.coeff + 2) = auVar11;
                eq_00->coeff[0] = local_68.coeff[0];
                pCVar7[iVar19].eq.coeff[1] = local_68.coeff[1];
              }
              uVar28 = (uint)(1.5 < (double)CONCAT44(uVar34,uVar33));
            }
          }
          iVar19 = uVar28 + iVar19;
        }
      }
      else {
        iVar19 = iVar19 + 1;
      }
    } while (iVar19 < this->noCircles1);
  }
  this->noCircles2 = iVar17;
  operator_delete__(px);
  operator_delete__(py);
  pNVar13 = this->nfa;
  if (pNVar13 == (NFALUT *)0x0) {
    return;
  }
  NFALUT::~NFALUT(pNVar13);
  operator_delete(pNVar13);
  return;
}

Assistant:

void EDCircles::ValidateCircles()
{
	double prec = PI / 16;  // Alignment precision
	double prob = 1.0 / 8;  // probability of alignment

	int points_buffer_size = 8 * (width + height);
	double *px = new double[points_buffer_size];
	double *py = new double[points_buffer_size];

	// logNT & LUT for NFA computation
	double logNT = 2 * log10((double)(width*height)) + log10((double)(width + height));

	int lutSize = (width + height) / 8;
	nfa = new NFALUT(lutSize, prob, logNT); // create look up table

	// Validate circles & ellipses
	bool validateAgain;
	int count = 0;
	for (int i = 0; i<noCircles1; ) {
		Circle *circle = &circles1[i];
		double xc = circle->xc;
		double yc = circle->yc;
		double radius = circle->r;

		// Skip potential invalid circles (sometimes these kinds of candidates get generated!)
		if (radius > MAX(width, height)) { i++; continue; }

		validateAgain = false;

		int noPoints = (int)(computeEllipsePerimeter(&circle->eq));

		if (noPoints > points_buffer_size)
		{
			i++;
			continue;
		}

		if (circle->isEllipse) {
			if (noPoints % 2) noPoints--;
			ComputeEllipsePoints(circle->eq.coeff, px, py, noPoints);

		}
		else {
			ComputeCirclePoints(xc, yc, radius, px, py, &noPoints);
		} //end-else

		int pr = -1;  // previous row
		int pc = -1;  // previous column

		int tr = -100;
		int tc = -100;
		int tcount = 0;

		int noPeripheryPixels = 0;
		int noEdgePixels = 0;
		int aligned = 0;
		for (int j = 0; j<noPoints; j++) {
			int r = (int)(py[j] + 0.5);
			int c = (int)(px[j] + 0.5);

			if (r == pr && c == pc) continue;
			noPeripheryPixels++;

			if (r <= 0 || r >= height - 1) continue;
			if (c <= 0 || c >= width - 1) continue;

			pr = r;
			pc = c;

			int dr = abs(r - tr);
			int dc = abs(c - tc);
			if (dr + dc >= 2) {
				tr = r;
				tc = c;
				tcount++;
			} //end-if

#if 1
			  //
			  // See if there is an edge pixel within 1 pixel vicinity
			  //
			if (edgeImg[r*width + c] != 255) {
				//   y-cy=-x-cx    y-cy=x-cx
				//         \       /
				//          \ IV. /
				//           \   / 
				//            \ / 
				//     III.    +   I. quadrant
				//            / \
				//           /   \ 
				//          / II. \
				//         /       \
				//
				// (x, y)-->(x-cx, y-cy)
				//
				
				int x = c;
				int y = r;

				int diff1 = (int)(y - yc - x + xc);
				int diff2 = (int)(y - yc + x - xc);

				if (diff1 < 0) {
					if (diff2 > 0) {
						// I. quadrant
						c = x - 1;
						if (c >= 1 && edgeImg[r*width + c] == 255) goto out;
						c = x + 1;
						if (c<width - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						c = x - 2;
						if (c >= 2 && edgeImg[r*width + c] == 255) goto out;
						c = x + 2;
						if (c<width - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					}
					else {
						// IV. quadrant
						r = y - 1;
						if (r >= 1 && edgeImg[r*width + c] == 255) goto out;
						r = y + 1;
						if (r<height - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						r = y - 2;
						if (r >= 2 && edgeImg[r*width + c] == 255) goto out;
						r = y + 2;
						if (r<height - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					} //end-else

				}
				else {
					if (diff2 > 0) {
						// II. quadrant
						r = y - 1;
						if (r >= 1 && edgeImg[r*width + c] == 255) goto out;
						r = y + 1;
						if (r<height - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						r = y - 2;
						if (r >= 2 && edgeImg[r*width + c] == 255) goto out;
						r = y + 2;
						if (r<height - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					}
					else {
						// III. quadrant
						c = x - 1;
						if (c >= 1 && edgeImg[r*width + c] == 255) goto out;
						c = x + 1;
						if (c<width - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						c = x - 2;
						if (c >= 2 && edgeImg[r*width + c] == 255) goto out;
						c = x + 2;
						if (c<width - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					} //end-else
				} //end-else

				r = pr;
				c = pc;
				continue;  // Ignore non-edge pixels. 
						   // This produces less false positives, but occationally misses on some valid circles
			} //end-if
		out:
			if (edgeImg[r*width + c] == 255) noEdgePixels++;
			//      map->edgeImg[r*width+c] = 254;
#endif

			// compute gx & gy
			int com1 = smoothImg[(r + 1)*width + c + 1] - smoothImg[(r - 1)*width + c - 1];
			int com2 = smoothImg[(r - 1)*width + c + 1] - smoothImg[(r + 1)*width + c - 1];

			int gx = com1 + com2 + smoothImg[r*width + c + 1] - smoothImg[r*width + c - 1];
			int gy = com1 - com2 + smoothImg[(r + 1)*width + c] - smoothImg[(r - 1)*width + c];
			double pixelAngle = nfa->myAtan2((double)gx, (double)-gy);

			double derivX, derivY;
			if (circle->isEllipse) {
				// Ellipse
				derivX = 2 * circle->eq.A()*c + circle->eq.B()*r + circle->eq.D();
				derivY = circle->eq.B()*c + 2 * circle->eq.C()*r + circle->eq.E();

			}
			else {
				// circle
				derivX = c - xc;
				derivY = r - yc;
			} //end-else

			double idealPixelAngle = nfa->myAtan2(derivX, -derivY);
			double diff = fabs(pixelAngle - idealPixelAngle);
			if (diff <= prec || diff >= PI - prec) aligned++;
		} //end-for

		double circumference;
		if (circle->isEllipse) circumference = computeEllipsePerimeter(&circle->eq);
		else                   circumference = TWOPI*radius;

		// Validate by NFA
		bool isValid = nfa->checkValidationByNFA(noPeripheryPixels, aligned);

		if (isValid) {
			circles2[count++] = circles1[i];

		}
		else if (circle->isEllipse == false && circle->coverRatio >= CANDIDATE_ELLIPSE_RATIO) {
			// Fit an ellipse to this circle, and try to revalidate
			double ellipseFitError = 1e10;
			EllipseEquation eq;

			if (EllipseFit(circle->x, circle->y, circle->noPixels, &eq)) {
				ellipseFitError = ComputeEllipseError(&eq, circle->x, circle->y, circle->noPixels);
			} //end-if

			if (ellipseFitError <= ELLIPSE_ERROR) {
				circle->isEllipse = true;
				circle->ellipseFitError = ellipseFitError;
				circle->eq = eq;

				validateAgain = true;
			} //end-if
		} //end-else

		if (validateAgain == false) i++;
	} //end-for

	noCircles2 = count;

	delete[] px;
	delete[] py;
	delete nfa;
}